

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thermo.cpp
# Opt level: O0

RealType __thiscall OpenMD::Thermo::getElectronicTemperature(Thermo *this)

{
  int iVar1;
  SnapshotManager *this_00;
  Snapshot *this_01;
  undefined8 *in_RDI;
  RealType RVar2;
  RealType eTemp;
  Snapshot *snap;
  
  this_00 = SimInfo::getSnapshotManager((SimInfo *)*in_RDI);
  this_01 = SnapshotManager::getCurrentSnapshot(this_00);
  if ((this_01->hasElectronicTemperature & 1U) == 0) {
    RVar2 = getElectronicKinetic(this);
    iVar1 = SimInfo::getNFluctuatingCharges((SimInfo *)*in_RDI);
    Snapshot::setElectronicTemperature(this_01,(RVar2 * 2.0) / ((double)iVar1 * 0.0019872156));
  }
  RVar2 = Snapshot::getElectronicTemperature(this_01);
  return RVar2;
}

Assistant:

RealType Thermo::getElectronicTemperature() {
    Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();

    if (!snap->hasElectronicTemperature) {
      RealType eTemp = (2.0 * this->getElectronicKinetic()) /
                       (info_->getNFluctuatingCharges() * Constants::kb);

      snap->setElectronicTemperature(eTemp);
    }

    return snap->getElectronicTemperature();
  }